

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_mesh_materials.cxx
# Opt level: O1

void __thiscall level_mesh::restore_game_materials(level_mesh *this,xr_cform *cform)

{
  pointer *ppbVar1;
  pointer *pp_Var2;
  vector<xray_re::_vector2<float>,_std::allocator<xray_re::_vector2<float>_>_> *this_00;
  pointer *pp_Var3;
  uint uVar4;
  iterator __position;
  pointer p_Var5;
  iterator iVar6;
  iterator __position_00;
  pointer p_Var7;
  iterator iVar8;
  pointer pbVar9;
  uint32_t uVar10;
  anon_union_8_2_d279a524_for_b_face_2 aVar11;
  long lVar12;
  uint uVar13;
  uint32_t *cf2m;
  ulong uVar14;
  ulong uVar15;
  pointer pbVar16;
  uint ghost;
  int iVar17;
  ulong uVar18;
  pointer pcVar19;
  pointer pcVar20;
  long lVar21;
  bool bVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  b_face face_template;
  undefined1 local_c8 [16];
  level_mesh *local_b8;
  pointer local_b0;
  anon_union_48_3_fb61167d_for_b_face_0 local_a8;
  undefined4 uStack_78;
  ushort uStack_74;
  undefined2 uStack_72;
  undefined4 uStack_70;
  undefined2 uStack_6c;
  undefined2 uStack_6a;
  long local_60;
  long local_58;
  vector<xray_re::xr_mesh_builder::b_face,std::allocator<xray_re::xr_mesh_builder::b_face>>
  *local_50;
  vector<xray_re::_vector3<float>,std::allocator<xray_re::_vector3<float>>> *local_48;
  pointer local_40;
  vector<xray_re::_vector3<float>,std::allocator<xray_re::_vector3<float>>> *local_38;
  
  cf2m = remap_cform_verts(this,cform);
  match_edges_faces(this,cform,cf2m);
  propagate_gamemtls(this);
  xray_re::msg("restoring fake colliders");
  uStack_70 = 0xffffffff;
  uStack_6a = 0;
  local_a8.field_0.v[0] = 0xffffffff;
  local_a8.field_0.v[1] = 0xffffffff;
  local_a8.field_0.v[2] = 0xffffffff;
  local_a8.field_0.n[0] = 0xffffffff;
  local_a8.field_0.n[1] = 0xffffffff;
  local_a8.field_0.n[2] = 0xffffffff;
  local_a8._24_8_ = 0xffffffffffffffff;
  local_a8.field_0.tc[2] = 0xffffffff;
  local_a8.field_0.link[0] = 0xffffffff;
  local_a8.field_0.link[1] = 0xffffffff;
  local_a8.field_0.link[2]._0_2_ = 0xffff;
  local_a8.field_0.link[2]._2_2_ = 0xffff;
  uStack_78 = 0xffffffff;
  uStack_74 = 0xffff;
  uStack_72 = 0;
  local_60 = (long)(this->super_xr_mesh_builder).m_normals.
                   super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->super_xr_mesh_builder).m_normals.
                   super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
  local_58 = (long)(this->super_xr_mesh_builder).m_faces.
                   super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->super_xr_mesh_builder).m_faces.
                   super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
                   ._M_impl.super__Vector_impl_data._M_start;
  pcVar20 = (cform->m_faces).super__Vector_base<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_40 = (cform->m_faces).
             super__Vector_base<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>._M_impl.
             super__Vector_impl_data._M_finish;
  local_b8 = this;
  if (pcVar20 != local_40) {
    local_48 = (vector<xray_re::_vector3<float>,std::allocator<xray_re::_vector3<float>>> *)
               &(this->super_xr_mesh_builder).m_normals;
    local_50 = (vector<xray_re::xr_mesh_builder::b_face,std::allocator<xray_re::xr_mesh_builder::b_face>>
                *)&(this->super_xr_mesh_builder).m_faces;
    pcVar19 = (cform->m_vertices).
              super__Vector_base<xray_re::cf_vertex,_std::allocator<xray_re::cf_vertex>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_38 = (vector<xray_re::_vector3<float>,std::allocator<xray_re::_vector3<float>>> *)
               &(this->super_xr_mesh_builder).super_xr_mesh.m_points;
    local_b0 = pcVar19;
    do {
      iVar17 = 0;
      lVar21 = 2;
      do {
        uVar4 = *(uint *)((long)&pcVar20->field_0 + lVar21 * 4);
        uVar13 = cf2m[uVar4];
        if (uVar13 == 0xffffffff) {
          iVar6._M_current =
               (this->super_xr_mesh_builder).super_xr_mesh.m_points.
               super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          p_Var5 = (this->super_xr_mesh_builder).super_xr_mesh.m_points.
                   super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (iVar6._M_current ==
              (this->super_xr_mesh_builder).super_xr_mesh.m_points.
              super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<xray_re::_vector3<float>,std::allocator<xray_re::_vector3<float>>>::
            _M_realloc_insert<xray_re::_vector3<float>const&>(local_38,iVar6,&pcVar19[uVar4].p);
            this = local_b8;
            pcVar19 = local_b0;
          }
          else {
            ((iVar6._M_current)->field_0).field_0.z = pcVar19[uVar4].p.field_0.field_0.z;
            *(undefined8 *)&(iVar6._M_current)->field_0 = *(undefined8 *)&pcVar19[uVar4].p.field_0;
            pp_Var2 = &(this->super_xr_mesh_builder).super_xr_mesh.m_points.
                       super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *pp_Var2 = *pp_Var2 + 1;
          }
          uVar13 = (int)((ulong)((long)iVar6._M_current - (long)p_Var5) >> 2) * -0x55555555;
          cf2m[uVar4] = uVar13 | 0x80000000;
LAB_001314a5:
          iVar17 = iVar17 + 1;
        }
        else if ((int)uVar13 < 0) {
          uVar13 = uVar13 & 0x7fffffff;
          goto LAB_001314a5;
        }
        *(uint *)((long)&local_a8 + lVar21 * 4) = uVar13;
        bVar22 = lVar21 != 0;
        lVar21 = lVar21 + -1;
      } while (bVar22);
      if (iVar17 != 0) {
        local_a8.field_0.tc[2] = 0;
        local_a8._24_8_ = 0;
        local_a8.field_0.n[0] =
             (int)((ulong)((long)(this->super_xr_mesh_builder).m_normals.
                                 super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->super_xr_mesh_builder).m_normals.
                                super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555;
        uStack_6a = *(undefined2 *)((long)&pcVar20->field_1 + 2);
        uStack_74 = *(ushort *)&pcVar20->field_1 & 0x3fff;
        uStack_78 = 0;
        uStack_72 = 0x11;
        __position._M_current =
             (this->super_xr_mesh_builder).m_faces.
             super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_a8.field_0.n[1] = local_a8.field_0.n[0];
        local_a8.field_0.n[2] = local_a8.field_0.n[0];
        if (__position._M_current ==
            (this->super_xr_mesh_builder).m_faces.
            super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<xray_re::xr_mesh_builder::b_face,std::allocator<xray_re::xr_mesh_builder::b_face>>
          ::_M_realloc_insert<xray_re::xr_mesh_builder::b_face_const&>
                    (local_50,__position,(b_face *)&local_a8.field_0);
          this = local_b8;
          pcVar19 = local_b0;
        }
        else {
          aVar11.field_1.sgroup._2_2_ = 0x11;
          aVar11._0_6_ = ((uint6)*(ushort *)&pcVar20->field_1 & 0x3fff) << 0x20;
          (__position._M_current)->field_1 = aVar11;
          (__position._M_current)->tag = uStack_70;
          (__position._M_current)->temp = uStack_6c;
          (__position._M_current)->sector = uStack_6a;
          *(ulong *)((long)&(__position._M_current)->field_0 + 0x20) =
               (ulong)local_a8.field_0.link[0] << 0x20;
          *(ulong *)((long)&(__position._M_current)->field_0 + 0x28) =
               CONCAT26(local_a8.field_0.link[2]._2_2_,
                        CONCAT24(local_a8.field_0.link[2]._0_2_,local_a8.field_0.link[1]));
          *(ulong *)((long)&(__position._M_current)->field_0 + 0x10) =
               CONCAT44(local_a8.field_0.n[0],local_a8.field_0.n[0]);
          *(undefined8 *)((long)&(__position._M_current)->field_0 + 0x18) = 0;
          *(ulong *)&(__position._M_current)->field_0 =
               CONCAT44(local_a8.field_0.v[1],local_a8.field_0.v[0]);
          *(ulong *)((long)&(__position._M_current)->field_0 + 8) =
               CONCAT44(local_a8.field_0.n[0],local_a8.field_0.v[2]);
          ppbVar1 = &(this->super_xr_mesh_builder).m_faces.
                     super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppbVar1 = *ppbVar1 + 1;
        }
        uVar15 = (ulong)local_a8.field_0.v[0];
        uVar14 = (ulong)local_a8.field_0.v[1];
        p_Var5 = (this->super_xr_mesh_builder).super_xr_mesh.m_points.
                 super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar18 = (ulong)local_a8.field_0.v[2];
        fVar25 = p_Var5[uVar14].field_0.field_0.x - p_Var5[uVar15].field_0.field_0.x;
        fVar26 = p_Var5[uVar14].field_0.field_0.y - p_Var5[uVar15].field_0.field_0.y;
        fVar24 = p_Var5[uVar14].field_0.field_0.z - p_Var5[uVar15].field_0.field_0.z;
        fVar27 = p_Var5[uVar18].field_0.field_0.x - p_Var5[uVar15].field_0.field_0.x;
        fVar23 = p_Var5[uVar18].field_0.field_0.y - p_Var5[uVar15].field_0.field_0.y;
        fVar28 = p_Var5[uVar18].field_0.field_0.z - p_Var5[uVar15].field_0.field_0.z;
        local_c8._0_4_ = fVar26 * fVar28 - fVar23 * fVar24;
        local_c8._4_4_ = fVar24 * fVar27 - fVar28 * fVar25;
        local_c8._8_4_ = fVar23 * fVar25 - fVar27 * fVar26;
        fVar23 = (float)local_c8._8_4_ * (float)local_c8._8_4_ +
                 (float)local_c8._0_4_ * (float)local_c8._0_4_ +
                 (float)local_c8._4_4_ * (float)local_c8._4_4_;
        if (fVar23 < 0.0) {
          fVar23 = sqrtf(fVar23);
          this = local_b8;
          pcVar19 = local_b0;
        }
        else {
          fVar23 = SQRT(fVar23);
        }
        local_c8._4_4_ = (float)local_c8._4_4_ / fVar23;
        local_c8._0_4_ = (float)local_c8._0_4_ / fVar23;
        local_c8._8_4_ = (float)local_c8._8_4_ / fVar23;
        iVar6._M_current =
             (this->super_xr_mesh_builder).m_normals.
             super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar6._M_current ==
            (this->super_xr_mesh_builder).m_normals.
            super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<xray_re::_vector3<float>,std::allocator<xray_re::_vector3<float>>>::
          _M_realloc_insert<xray_re::_vector3<float>const&>
                    (local_48,iVar6,(_vector3<float> *)local_c8);
          this = local_b8;
          pcVar19 = local_b0;
        }
        else {
          ((iVar6._M_current)->field_0).field_0.z = (float)local_c8._8_4_;
          *(undefined8 *)&(iVar6._M_current)->field_0 = local_c8._0_8_;
          pp_Var2 = &(this->super_xr_mesh_builder).m_normals.
                     super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *pp_Var2 = *pp_Var2 + 1;
        }
      }
      pcVar20 = pcVar20 + 1;
    } while (pcVar20 != local_40);
  }
  operator_delete__(cf2m);
  lVar12 = local_58;
  lVar21 = local_60;
  if (local_60 !=
      (long)(local_b8->super_xr_mesh_builder).m_normals.
            super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(local_b8->super_xr_mesh_builder).m_normals.
            super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
    xray_re::xr_mesh_builder::remove_back_faces(&local_b8->super_xr_mesh_builder,0.001);
    __position_00._M_current =
         (local_b8->super_xr_mesh_builder).m_texcoords.
         super__Vector_base<xray_re::_vector2<float>,_std::allocator<xray_re::_vector2<float>_>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    p_Var7 = (local_b8->super_xr_mesh_builder).m_texcoords.
             super__Vector_base<xray_re::_vector2<float>,_std::allocator<xray_re::_vector2<float>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    this_00 = &(local_b8->super_xr_mesh_builder).m_texcoords;
    local_c8._0_8_ = 0;
    if (__position_00._M_current ==
        (local_b8->super_xr_mesh_builder).m_texcoords.
        super__Vector_base<xray_re::_vector2<float>,_std::allocator<xray_re::_vector2<float>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<xray_re::_vector2<float>,std::allocator<xray_re::_vector2<float>>>::
      _M_realloc_insert<xray_re::_vector2<float>const&>
                ((vector<xray_re::_vector2<float>,std::allocator<xray_re::_vector2<float>>> *)
                 this_00,__position_00,(_vector2<float> *)local_c8);
    }
    else {
      (__position_00._M_current)->field_0 = (anon_union_8_3_f28016de_for__vector2<float>_1)0x0;
      pp_Var3 = &(local_b8->super_xr_mesh_builder).m_texcoords.
                 super__Vector_base<xray_re::_vector2<float>,_std::allocator<xray_re::_vector2<float>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *pp_Var3 = *pp_Var3 + 1;
    }
    local_c8._0_8_ = 0x3f80000000000000;
    iVar8._M_current =
         (local_b8->super_xr_mesh_builder).m_texcoords.
         super__Vector_base<xray_re::_vector2<float>,_std::allocator<xray_re::_vector2<float>_>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar8._M_current ==
        (local_b8->super_xr_mesh_builder).m_texcoords.
        super__Vector_base<xray_re::_vector2<float>,_std::allocator<xray_re::_vector2<float>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<xray_re::_vector2<float>,std::allocator<xray_re::_vector2<float>>>::
      _M_realloc_insert<xray_re::_vector2<float>const&>
                ((vector<xray_re::_vector2<float>,std::allocator<xray_re::_vector2<float>>> *)
                 this_00,iVar8,(_vector2<float> *)local_c8);
    }
    else {
      (iVar8._M_current)->field_0 =
           (anon_union_8_3_f28016de_for__vector2<float>_1)0x3f80000000000000;
      pp_Var3 = &(local_b8->super_xr_mesh_builder).m_texcoords.
                 super__Vector_base<xray_re::_vector2<float>,_std::allocator<xray_re::_vector2<float>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *pp_Var3 = *pp_Var3 + 1;
    }
    local_c8._0_8_ = 0x3f800000;
    iVar8._M_current =
         (local_b8->super_xr_mesh_builder).m_texcoords.
         super__Vector_base<xray_re::_vector2<float>,_std::allocator<xray_re::_vector2<float>_>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar8._M_current ==
        (local_b8->super_xr_mesh_builder).m_texcoords.
        super__Vector_base<xray_re::_vector2<float>,_std::allocator<xray_re::_vector2<float>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<xray_re::_vector2<float>,std::allocator<xray_re::_vector2<float>>>::
      _M_realloc_insert<xray_re::_vector2<float>const&>
                ((vector<xray_re::_vector2<float>,std::allocator<xray_re::_vector2<float>>> *)
                 this_00,iVar8,(_vector2<float> *)local_c8);
    }
    else {
      (iVar8._M_current)->field_0 = (anon_union_8_3_f28016de_for__vector2<float>_1)0x3f800000;
      pp_Var3 = &(local_b8->super_xr_mesh_builder).m_texcoords.
                 super__Vector_base<xray_re::_vector2<float>,_std::allocator<xray_re::_vector2<float>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *pp_Var3 = *pp_Var3 + 1;
    }
    pbVar16 = (pointer)((long)&((local_b8->super_xr_mesh_builder).m_faces.
                                super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
                                ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar12);
    pbVar9 = (local_b8->super_xr_mesh_builder).m_faces.
             super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar16 != pbVar9) {
      uVar15 = (lVar21 >> 2) * -0x5555555555555555;
      uVar10 = (uint32_t)((ulong)((long)__position_00._M_current - (long)p_Var7) >> 3);
      do {
        uVar14 = (ulong)(pbVar16->field_0).field_0.n[0];
        if (uVar15 < uVar14 || uVar15 - uVar14 == 0) {
          (pbVar16->field_0).field_0.tc[0] = uVar10;
          (pbVar16->field_0).field_0.tc[1] = uVar10 + 1;
          (pbVar16->field_0).field_0.tc[2] = uVar10 + 2;
        }
        pbVar16 = pbVar16 + 1;
      } while (pbVar16 != pbVar9);
    }
  }
  return;
}

Assistant:

void level_mesh::restore_game_materials(const xr_cform& cform)
{
	uint32_t* cf2m = remap_cform_verts(cform);
	match_edges_faces(cform, cf2m);
	propagate_gamemtls();

	msg("restoring fake colliders");
	b_face face_template;
	size_t num_normals = m_normals.size(), num_faces = m_faces.size();
	const cf_vertex* verts = &cform.vertices()[0];
	for (cf_face_vec_cit it = cform.faces().begin(), end = cform.faces().end(); it != end; ++it) {
		unsigned ghost = 0;
		for (uint32_t i = 3, vx; i != 0;) {
			const uint32_t VF_SHARED = 0x80000000;
			uint32_t vxm = cf2m[vx = it->v[--i]];
			if (vxm == BAD_IDX) {
				vxm = uint32_t(m_points.size() & UINT32_MAX);
				m_points.push_back(verts[vx].p);
				cf2m[vx] = vxm | VF_SHARED;
				++ghost;
			} else if (vxm & VF_SHARED) {
				vxm &= ~VF_SHARED;
				++ghost;
			}
			face_template.v[i] = vxm;
		}
		if (ghost) {
			face_template.tc0 = face_template.tc1 = face_template.tc2 = 0;
			face_template.n0 = face_template.n1 = face_template.n2 =
					uint32_t(m_normals.size() & UINT32_MAX);
			face_template.sector = it->sector;
			face_template.surface.set(0, 0, it->material, RSF_COLLISION|RSF_AUTOMATIC);
			m_faces.push_back(face_template);
			m_normals.push_back(fvector3().calc_normal(m_points[face_template.v0],
					m_points[face_template.v1], m_points[face_template.v2]));
		}
	}
	delete[] cf2m;
	if (num_normals != m_normals.size()) {
		remove_back_faces(1e-3f);

		uint32_t tc_base = uint32_t(m_texcoords.size() & UINT32_MAX);
		m_texcoords.push_back(fvector2().set(0.f, 0.f));
		m_texcoords.push_back(fvector2().set(0.f, 1.f));
		m_texcoords.push_back(fvector2().set(1.f, 0.f));

		for (b_face_vec_it it = m_faces.begin() + num_faces, end = m_faces.end(); it != end; ++it) {
			if (it->n0 >= num_normals) {
				it->tc0 = tc_base;
				it->tc1 = tc_base + 1;
				it->tc2 = tc_base + 2;
			}
		}
	}
}